

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectRuleFiles
          (cmMakefileTargetGenerator *this,cmSourceFile *source)

{
  iterator iVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  string obj;
  string depMakeFile;
  string objFullPath;
  string srcFullPath;
  string local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string dir;
  
  cmLocalGenerator::GetSourceFileLanguage_abi_cxx11_
            (&local_1c8,&this->LocalGenerator->super_cmLocalGenerator,source);
  if (local_1c8._M_string_length != 0) {
    cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,source);
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
              (&obj,this->LocalGenerator,this->Target);
    std::__cxx11::string::append((char *)&obj);
    std::__cxx11::string::append((string *)&obj);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->ObjectFiles)._M_t,&obj);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->ObjectFiles,&obj);
      cmsys::SystemTools::GetFilenamePath(&dir,&obj);
      cmLocalUnixMakefileGenerator3::ConvertToFullPath(&depMakeFile,this->LocalGenerator,&dir);
      cmsys::SystemTools::MakeDirectory(depMakeFile._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&depMakeFile);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Objects,&obj);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->CleanFiles,&obj);
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depMakeFile._M_dataplus._M_p = (pointer)&depMakeFile.field_2;
      depMakeFile._M_string_length = 0;
      depMakeFile.field_2._M_local_buf[0] = '\0';
      WriteObjectBuildFile(this,&obj,&local_1c8,source,&depends);
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      std::__cxx11::string::string((string *)&objFullPath,pcVar4,(allocator *)&srcFullPath);
      std::__cxx11::string::append((char *)&objFullPath);
      std::__cxx11::string::append((string *)&objFullPath);
      Convert(&srcFullPath,this,&objFullPath,FULL,UNCHANGED);
      std::__cxx11::string::operator=((string *)&objFullPath,(string *)&srcFullPath);
      std::__cxx11::string::~string((string *)&srcFullPath);
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      Convert(&srcFullPath,this,psVar3,FULL,UNCHANGED);
      cmLocalUnixMakefileGenerator3::AddImplicitDepends
                (this->LocalGenerator,this->Target,&local_1c8,objFullPath._M_dataplus._M_p,
                 srcFullPath._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&srcFullPath);
      std::__cxx11::string::~string((string *)&objFullPath);
      std::__cxx11::string::~string((string *)&depMakeFile);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      std::__cxx11::string::~string((string *)&dir);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dir);
      poVar2 = std::operator<<((ostream *)&dir,"Warning: Source file \"");
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      poVar2 = std::operator<<(poVar2,"\" is listed multiple times for target \"");
      poVar2 = std::operator<<(poVar2,(string *)&this->Target->Name);
      std::operator<<(poVar2,"\".");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Message(depMakeFile._M_dataplus._M_p,"Warning");
      std::__cxx11::string::~string((string *)&depMakeFile);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dir);
    }
    std::__cxx11::string::~string((string *)&obj);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void cmMakefileTargetGenerator
::WriteObjectRuleFiles(cmSourceFile const& source)
{
  // Identify the language of the source file.
  const std::string& lang =
    this->LocalGenerator->GetSourceFileLanguage(source);
  if(lang.empty())
    {
    // don't know anything about this file so skip it
    return;
    }

  // Get the full path name of the object file.
  std::string const& objectName = this->GeneratorTarget
                                      ->GetObjectName(&source);
  std::string obj = this->LocalGenerator->GetTargetDirectory(*this->Target);
  obj += "/";
  obj += objectName;

  // Avoid generating duplicate rules.
  if(this->ObjectFiles.find(obj) == this->ObjectFiles.end())
    {
    this->ObjectFiles.insert(obj);
    }
  else
    {
    std::ostringstream err;
    err << "Warning: Source file \""
        << source.GetFullPath()
        << "\" is listed multiple times for target \""
        << this->Target->GetName()
        << "\".";
    cmSystemTools::Message(err.str().c_str(), "Warning");
    return;
    }

  // Create the directory containing the object file.  This may be a
  // subdirectory under the target's directory.
  std::string dir = cmSystemTools::GetFilenamePath(obj);
  cmSystemTools::MakeDirectory
    (this->LocalGenerator->ConvertToFullPath(dir).c_str());

  // Save this in the target's list of object files.
  this->Objects.push_back(obj);
  this->CleanFiles.push_back(obj);

  // TODO: Remove
  //std::string relativeObj
  //= this->LocalGenerator->GetHomeRelativeOutputPath();
  //relativeObj += obj;

  // we compute some depends when writing the depend.make that we will also
  // use in the build.make, same with depMakeFile
  std::vector<std::string> depends;
  std::string depMakeFile;

  // generate the build rule file
  this->WriteObjectBuildFile(obj, lang, source, depends);

  // The object file should be checked for dependency integrity.
  std::string objFullPath = this->Makefile->GetCurrentBinaryDirectory();
  objFullPath += "/";
  objFullPath += obj;
  objFullPath =
    this->Convert(objFullPath, cmLocalGenerator::FULL);
  std::string srcFullPath =
    this->Convert(source.GetFullPath(), cmLocalGenerator::FULL);
  this->LocalGenerator->
    AddImplicitDepends(*this->Target, lang,
                       objFullPath.c_str(),
                       srcFullPath.c_str());
}